

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLs_AccessARKODEMassMem
              (void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKLsMassMem *arkls_mem)

{
  long lVar1;
  long *in_RCX;
  long *in_RDX;
  char *in_RSI;
  long in_RDI;
  void *ark_step_massmem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-1,0x1006,in_RSI,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else {
    *in_RDX = in_RDI;
    lVar1 = (**(code **)(*in_RDX + 0x218))(*in_RDX);
    if (lVar1 == 0) {
      arkProcessError((ARKodeMem)*in_RDX,-6,0x100e,in_RSI,
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                      ,"Mass matrix solver memory is NULL.");
      local_4 = -6;
    }
    else {
      *in_RCX = lVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int arkLs_AccessARKODEMassMem(void* arkode_mem, const char* fname,
                              ARKodeMem* ark_mem, ARKLsMassMem* arkls_mem)
{
  void* ark_step_massmem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARKLS_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_ARKMEM_NULL);
    return (ARKLS_MEM_NULL);
  }
  *ark_mem         = (ARKodeMem)arkode_mem;
  ark_step_massmem = (*ark_mem)->step_getmassmem(*ark_mem);
  if (ark_step_massmem == NULL)
  {
    arkProcessError(*ark_mem, ARKLS_MASSMEM_NULL, __LINE__, fname, __FILE__,
                    MSG_LS_MASSMEM_NULL);
    return (ARKLS_MASSMEM_NULL);
  }
  *arkls_mem = (ARKLsMassMem)ark_step_massmem;
  return (ARKLS_SUCCESS);
}